

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  Curl_llist *list;
  void **ppvVar1;
  _Bool connected;
  connectdata *pcVar2;
  undefined8 *puVar3;
  FILEPROTO *pFVar4;
  wildcard_dtor p_Var5;
  connectdata *pcVar6;
  CURLcode CVar7;
  wildcard_states wVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  ftp_parselist_data **parserp;
  ftp_parselist_data *pfVar12;
  
  pcVar2 = data->conn;
  *done = false;
  (pcVar2->proto).ftpc.wait_data_conn = false;
  if (((data->state).field_0x6d0 & 0x40) == 0) {
    CVar7 = ftp_parse_url_path(data);
    if (CVar7 == CURLE_OK) {
LAB_004b0fa0:
      pcVar2 = data->conn;
      (data->req).size = -1;
      Curl_pgrsSetUploadCounter(data,0);
      Curl_pgrsSetDownloadCounter(data,0);
      Curl_pgrsSetUploadSize(data,-1);
      Curl_pgrsSetDownloadSize(data,-1);
      (pcVar2->proto).ftpc.ctl_valid = true;
      pcVar6 = data->conn;
      if (((data->set).field_0x8e5 & 2) != 0) {
        ((data->req).p.file)->fd = 1;
      }
      *done = false;
      CVar7 = ftp_state_quote(data,true,FTP_QUOTE);
      if (CVar7 == CURLE_OK) {
        CVar7 = ftp_multi_statemach(data,done);
        connected = (pcVar6->bits).tcpconnect[1];
        Curl_infof(data,"ftp_perform ends with SECONDARY: %d",(ulong)connected);
        if (CVar7 == CURLE_OK) {
          if (*done != true) {
            return CURLE_OK;
          }
          CVar7 = ftp_dophase_done(data,connected);
          return CVar7;
        }
      }
      freedirs(&(pcVar2->proto).ftpc);
    }
    return CVar7;
  }
  list = &(data->wildcard).filelist;
  ppvVar1 = &(data->wildcard).protdata;
LAB_004b0bb6:
  wVar8 = (data->wildcard).state;
LAB_004b0bbc:
  switch(wVar8) {
  case CURLWC_CLEAR:
  case CURLWC_ERROR:
  case CURLWC_DONE:
    p_Var5 = (data->wildcard).dtor;
    CVar7 = CURLE_OK;
    if (p_Var5 != (wildcard_dtor)0x0) {
      (*p_Var5)(*ppvVar1);
    }
    break;
  case CURLWC_INIT:
    pFVar4 = (data->req).p.file;
    pcVar9 = pFVar4->path;
    pcVar11 = strrchr(pcVar9,0x2f);
    if (pcVar11 == (char *)0x0) {
      if (*pcVar9 == '\0') goto LAB_004b0f00;
      pcVar11 = (*Curl_cstrdup)(pcVar9);
      (data->wildcard).pattern = pcVar11;
LAB_004b0e2a:
      if (pcVar11 == (char *)0x0) {
        CVar7 = CURLE_OUT_OF_MEMORY;
      }
      else {
        *pcVar9 = '\0';
        parserp = (ftp_parselist_data **)(*Curl_ccalloc)(1,0x18);
        if (parserp == (ftp_parselist_data **)0x0) {
          CVar7 = CURLE_OUT_OF_MEMORY;
        }
        else {
          pfVar12 = Curl_ftp_parselist_data_alloc();
          *parserp = pfVar12;
          if (pfVar12 == (ftp_parselist_data *)0x0) {
            CVar7 = CURLE_OUT_OF_MEMORY;
          }
          else {
            (data->wildcard).protdata = parserp;
            (data->wildcard).dtor = wc_data_dtor;
            if ((data->set).ftp_filemethod == '\x02') {
              (data->set).ftp_filemethod = '\x01';
            }
            CVar7 = ftp_parse_url_path(data);
            if (CVar7 == CURLE_OK) {
              pcVar9 = (*Curl_cstrdup)(pFVar4->path);
              (data->wildcard).path = pcVar9;
              CVar7 = CURLE_OUT_OF_MEMORY;
              if (pcVar9 != (char *)0x0) {
                parserp[1] = (ftp_parselist_data *)(data->set).fwrite_func;
                (data->set).fwrite_func = Curl_ftp_parselist;
                parserp[2] = (ftp_parselist_data *)(data->set).out;
                (data->set).out = data;
                CVar7 = CURLE_OK;
                Curl_infof(data,"Wildcard - Parsing started");
                goto LAB_004b0f68;
              }
            }
          }
          Curl_ftp_parselist_data_free(parserp);
          (*Curl_cfree)(parserp);
        }
        (*Curl_cfree)((data->wildcard).pattern);
        (data->wildcard).pattern = (char *)0x0;
        *ppvVar1 = (void *)0x0;
        (data->wildcard).dtor = (wildcard_dtor)0x0;
      }
    }
    else {
      if (pcVar11[1] != '\0') {
        pcVar9 = pcVar11 + 1;
        pcVar11 = (*Curl_cstrdup)(pcVar9);
        (data->wildcard).pattern = pcVar11;
        goto LAB_004b0e2a;
      }
LAB_004b0f00:
      (data->wildcard).state = CURLWC_CLEAN;
      CVar7 = ftp_parse_url_path(data);
    }
LAB_004b0f68:
    if ((data->wildcard).state != CURLWC_CLEAN) {
      wVar8 = (uint)(CVar7 != CURLE_OK) * 4 + CURLWC_MATCHING;
      goto LAB_004b0f80;
    }
    goto LAB_004b0f94;
  case CURLWC_MATCHING:
    goto switchD_004b0bcf_caseD_2;
  case CURLWC_DOWNLOADING:
    puVar3 = (undefined8 *)((data->wildcard).filelist.head)->ptr;
    pFVar4 = (data->req).p.file;
    pcVar9 = curl_maprintf("%s%s",(data->wildcard).path,*puVar3);
    if (pcVar9 == (char *)0x0) {
      CVar7 = CURLE_OUT_OF_MEMORY;
    }
    else {
      (*Curl_cfree)(pFVar4->freepath);
      pFVar4->path = pcVar9;
      pFVar4->freepath = pcVar9;
      Curl_infof(data,"Wildcard - START of \"%s\"",*puVar3);
      if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
        Curl_set_in_callback(data,true);
        lVar10 = (*(data->set).chunk_bgn)
                           (puVar3,(data->wildcard).customptr,(int)(data->wildcard).filelist.size);
        Curl_set_in_callback(data,false);
        if (lVar10 == 2) {
          Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar3);
          wVar8 = CURLWC_SKIP;
          goto LAB_004b0d74;
        }
        if (lVar10 == 1) {
          CVar7 = CURLE_CHUNK_FAILED;
          break;
        }
      }
      wVar8 = CURLWC_SKIP;
      if (*(int *)(puVar3 + 1) != 0) goto LAB_004b0d74;
      if ((*(byte *)(puVar3 + 0xc) & 0x40) != 0) {
        (pcVar2->proto).ftpc.known_filesize = puVar3[5];
      }
      CVar7 = ftp_parse_url_path(data);
      if (CVar7 == CURLE_OK) {
        CVar7 = CURLE_OK;
        Curl_llist_remove(list,(data->wildcard).filelist.head,(void *)0x0);
        if ((data->wildcard).filelist.size == 0) {
          (data->wildcard).state = CURLWC_CLEAN;
          goto LAB_004b0fa0;
        }
      }
    }
    break;
  case CURLWC_CLEAN:
    if ((undefined8 *)*ppvVar1 == (undefined8 *)0x0) {
      wVar8 = CURLWC_DONE;
      CVar7 = CURLE_OK;
    }
    else {
      CVar7 = Curl_ftp_parselist_geterror(**ppvVar1);
      wVar8 = (CVar7 == CURLE_OK) + CURLWC_ERROR;
    }
LAB_004b0f80:
    (data->wildcard).state = wVar8;
    goto LAB_004b0f86;
  case CURLWC_SKIP:
    goto switchD_004b0bcf_caseD_5;
  default:
    goto switchD_004b0bcf_default;
  }
  wVar8 = (data->wildcard).state;
LAB_004b0f86:
  if ((wVar8 | CURLWC_MATCHING) == CURLWC_DONE) {
    return CURLE_OK;
  }
LAB_004b0f94:
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
  goto LAB_004b0fa0;
switchD_004b0bcf_default:
  do {
  } while( true );
switchD_004b0bcf_caseD_5:
  if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
    Curl_set_in_callback(data,true);
    (*(data->set).chunk_end)((data->wildcard).customptr);
    Curl_set_in_callback(data,false);
  }
  Curl_llist_remove(list,(data->wildcard).filelist.head,(void *)0x0);
  wVar8 = ((data->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
  (data->wildcard).state = wVar8;
  goto LAB_004b0bbc;
switchD_004b0bcf_caseD_2:
  puVar3 = (undefined8 *)(data->wildcard).protdata;
  (data->set).fwrite_func = (curl_write_callback)puVar3[1];
  (data->set).out = (void *)puVar3[2];
  puVar3[1] = 0;
  puVar3[2] = 0;
  (data->wildcard).state = CURLWC_DOWNLOADING;
  CVar7 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
  wVar8 = CURLWC_CLEAN;
  if (CVar7 == CURLE_OK) {
    if ((data->wildcard).filelist.size == 0) {
      (data->wildcard).state = CURLWC_CLEAN;
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }
  else {
LAB_004b0d74:
    (data->wildcard).state = wVar8;
  }
  goto LAB_004b0bb6;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard.state == CURLWC_SKIP ||
      data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}